

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O3

bool __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::isIrrelevant
          (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this,VREdge *edge)

{
  bool bVar1;
  Function *pFVar2;
  bool bVar3;
  
  bVar3 = true;
  if (((&edge->source)[this->dir == FORWARD] != (VRLocation *)0x0) &&
     (bVar1 = SimpleVisit::wasVisited
                        (&this->super_SimpleVisit,(&edge->source)[this->dir == FORWARD]), !bVar1)) {
    if ((((edge->op)._M_t.super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>.
          _M_t.super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
          super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl)->type == INSTRUCTION) &&
       (pFVar2 = (Function *)llvm::Instruction::getFunction(), pFVar2 != this->function)) {
      return true;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool isIrrelevant(VREdge *edge) const {
            VRLocation *next = getNextLocation(edge);
            return !next || Visit::wasVisited(next) || inOtherFunction(edge);
        }